

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_print(lua_State *L)

{
  cTValue *o;
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  ulong uVar4;
  TValue *pTVar5;
  char *s;
  long lVar6;
  long lVar7;
  bool bVar8;
  size_t size;
  char buf [32];
  ulong local_60;
  char local_58 [40];
  
  pTVar2 = L->base;
  pTVar3 = L->top;
  lVar6 = (long)pTVar3 - (long)pTVar2 >> 3;
  uVar4 = (ulong)(L->env).gcptr32;
  uVar1 = *(uint *)((ulong)pTVar2[-1].u32.lo + 0x20);
  pTVar5 = (TValue *)
           ((ulong)*(uint *)(uVar4 + 0x14) +
           (ulong)(*(uint *)(uVar4 + 0x1c) & *(uint *)((ulong)uVar1 + 8)) * 0x18);
  do {
    if ((*(uint32_t *)((long)pTVar5 + 0xc) == 0xfffffffb) && (pTVar5[1].u32.lo == uVar1))
    goto LAB_00142a67;
    pTVar5 = (TValue *)(ulong)pTVar5[2].u32.lo;
  } while (pTVar5 != (TValue *)0x0);
  pTVar5 = (TValue *)0x0;
LAB_00142a67:
  if ((pTVar5 == (TValue *)0x0) || ((pTVar5->field_2).it == 0xffffffff)) {
    L->top = pTVar3 + 1;
    (pTVar3->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)pTVar2[-1].u32.lo + 0x20);
    (pTVar3->field_2).it = 0xfffffffb;
    lua_gettable(L,-0x2712);
    pTVar5 = L->top + -1;
  }
  else {
    L->top = pTVar3 + 1;
    pTVar3->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar5;
  }
  if ((pTVar5->field_2).it == 0xfffffff7) {
    bVar8 = *(char *)((ulong)(pTVar5->u32).lo + 6) == '\x13';
  }
  else {
    bVar8 = false;
  }
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      o = (cTValue *)((long)L->base + lVar7);
      if (bVar8) {
        uVar1 = *(uint *)((long)L->base + lVar7 + 4);
        if (uVar1 == 0xfffffffb) {
          local_60 = (ulong)*(uint *)((ulong)(o->u32).lo + 0xc);
          s = (char *)((ulong)(o->u32).lo + 0x10);
        }
        else {
          if (0xfffefffe < uVar1 || !bVar8) goto LAB_00142b24;
          s = local_58;
          local_60 = lj_str_bufnum(s,o);
        }
      }
      else {
LAB_00142b24:
        L->top[1] = *o;
        *L->top = L->top[-1];
        pTVar5 = L->top;
        L->top = pTVar5 + 2;
        lj_vm_call(L,pTVar5 + 1,2);
        s = lua_tolstring(L,-1,&local_60);
        if (s == (char *)0x0) {
          lj_err_caller(L,LJ_ERR_PRTOSTR);
        }
        L->top = L->top + -1;
      }
      if (lVar7 != 0) {
        putchar(9);
      }
      fwrite(s,1,local_60,_stdout);
      lVar7 = lVar7 + 8;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  putchar(10);
  return 0;
}

Assistant:

LJLIB_CF(print)
{
  ptrdiff_t i, nargs = L->top - L->base;
  cTValue *tv = lj_tab_getstr(tabref(L->env), strV(lj_lib_upvalue(L, 1)));
  int shortcut;
  if (tv && !tvisnil(tv)) {
    copyTV(L, L->top++, tv);
  } else {
    setstrV(L, L->top++, strV(lj_lib_upvalue(L, 1)));
    lua_gettable(L, LUA_GLOBALSINDEX);
    tv = L->top-1;
  }
  shortcut = (tvisfunc(tv) && funcV(tv)->c.ffid == FF_tostring);
  for (i = 0; i < nargs; i++) {
    const char *str;
    size_t size;
    cTValue *o = &L->base[i];
    if (shortcut && tvisstr(o)) {
      str = strVdata(o);
      size = strV(o)->len;
    } else if (shortcut && tvisint(o)) {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, intV(o));
      size = (size_t)(buf+LJ_STR_INTBUF-p);
      str = p;
    } else if (shortcut && tvisnum(o)) {
      char buf[LJ_STR_NUMBUF];
      size = lj_str_bufnum(buf, o);
      str = buf;
    } else {
      copyTV(L, L->top+1, o);
      copyTV(L, L->top, L->top-1);
      L->top += 2;
      lua_call(L, 1, 1);
      str = lua_tolstring(L, -1, &size);
      if (!str)
	lj_err_caller(L, LJ_ERR_PRTOSTR);
      L->top--;
    }
    if (i)
      putchar('\t');
    fwrite(str, 1, size, stdout);
  }
  putchar('\n');
  return 0;
}